

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter_gui.c
# Opt level: O0

void sendatoms(int argc,t_atom *argv,int raw)

{
  t_float tVar1;
  t_atom *a;
  int i;
  int raw_local;
  t_atom *argv_local;
  int argc_local;
  
  _i = argv;
  for (a._0_4_ = 0; (int)a < argc; a._0_4_ = (int)a + 1) {
    switch(_i->a_type) {
    case A_FLOAT:
      tVar1 = atom_getfloat(_i);
      sys_vgui("%g ",(double)tVar1);
      break;
    case A_SYMBOL:
    case A_DOLLSYM:
      if (raw == 0) {
        str_escape(((_i->a_w).w_symbol)->s_name,0);
        sys_vgui("{%s} ");
      }
      else {
        sys_vgui("%s ");
      }
      break;
    case A_POINTER:
      sys_vgui("%p ");
      break;
    case A_SEMI:
      sys_vgui("\\; ");
      break;
    case A_COMMA:
      if (raw == 0) {
        sys_vgui("{,} ");
      }
      else {
        sys_vgui(", ");
      }
      break;
    default:
      break;
    case A_DOLLAR:
      if (raw == 0) {
        sys_vgui("{$%d} ");
      }
      else {
        sys_vgui("$%d ");
      }
    }
    _i = _i + 1;
  }
  return;
}

Assistant:

static void sendatoms(int argc, t_atom*argv, int raw) {
    int i;
    for(i=0; i<argc; i++)
    {
        t_atom *a=argv++;
        switch (a->a_type) {
        default:
            break;
        case A_FLOAT:
                /* HACK: currently ATOMARRAY is only used for setting fonts
                 * and Tcl/Tk is picky when it receives non-integers as fontsize
                 */
            sys_vgui("%g ", atom_getfloat(a));
            break;
        case A_DOLLAR:
            if(raw)
                sys_vgui("$%d ", a->a_w.w_index);
            else
                sys_vgui("{$%d} ", a->a_w.w_index);
            break;
        case A_DOLLSYM:
        case A_SYMBOL:
            if(raw)
                sys_vgui("%s ", a->a_w.w_symbol->s_name);
            else
                sys_vgui("{%s} ", str_escape(a->a_w.w_symbol->s_name, 0));
            break;
        case A_POINTER:
            sys_vgui("%p ", a->a_w.w_gpointer);
            break;
        case A_SEMI:
            sys_vgui("\\; ");
            break;
        case A_COMMA:
            if (raw)
                sys_vgui(", ");
            else
                sys_vgui("{,} ");
            break;
        }
    }
}